

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGenericPoolAllocator.cpp
# Opt level: O2

bool __thiscall btGenericPoolAllocator::freeMemory(btGenericPoolAllocator *this,void *pointer)

{
  bool bVar1;
  ulong uVar2;
  
  bVar1 = false;
  for (uVar2 = 0; (bVar1 == false && (uVar2 < this->m_pool_count)); uVar2 = uVar2 + 1) {
    bVar1 = btGenericMemoryPool::freeMemory(this->m_pools[uVar2],pointer);
  }
  if (bVar1 == false) {
    btAlignedFreeInternal(pointer);
  }
  return true;
}

Assistant:

bool btGenericPoolAllocator::freeMemory(void * pointer)
{
	bool result = false;

	size_t i = 0;
	while(i<m_pool_count && result == false)
	{
		result = m_pools[i]->freeMemory(pointer);
		++i;
	}

	if(result) return true;

	return failback_free(pointer);
}